

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collator.cpp
# Opt level: O2

long __thiscall
booster::locale::impl_icu::collate_impl<wchar_t>::do_hash
          (collate_impl<wchar_t> *this,level_type level,wchar_t *b,wchar_t *e)

{
  state_type sVar1;
  vector<unsigned_char,_std::allocator<unsigned_char>_> tmp;
  uchar local_21;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_20;
  
  do_basic_transform((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_20,this,level,b
                     ,e);
  local_21 = '\0';
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_20,&local_21);
  sVar1 = gnu_gettext::pj_winberger_hash_function
                    ((char *)local_20._M_impl.super__Vector_impl_data._M_start);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_20);
  return (ulong)sVar1;
}

Assistant:

long do_hash(level_type level,CharType const *b,CharType const *e) const
                {
                    std::vector<uint8_t> tmp = do_basic_transform(level,b,e);
                    tmp.push_back(0);
                    return gnu_gettext::pj_winberger_hash_function(reinterpret_cast<char *>(&tmp.front()));
                }